

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O0

void __thiscall
HD44780AnalyzerResults::GenerateFrameTabularText
          (HD44780AnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *__dest;
  char local_318 [8];
  char number_str [128];
  undefined8 local_280;
  undefined8 uStack_278;
  ulonglong local_270;
  ushort local_260;
  undefined8 uStack_258;
  Frame frame;
  char local_228 [8];
  char s2 [256];
  char s1 [256];
  DisplayBase display_base_local;
  U64 frame_index_local;
  HD44780AnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  Frame::Frame((Frame *)&uStack_258);
  AnalyzerResults::GetFrame((ulonglong)&local_280);
  uStack_258 = local_280;
  _frame = uStack_278;
  Frame::~Frame((Frame *)&local_280);
  AnalyzerHelpers::GetNumberString(local_270,display_base,8,local_318,0x80);
  if ((local_260 & 0x200) == 0) {
    strcpy(s2 + 0xf8,"Write ");
  }
  else {
    strcpy(s2 + 0xf8,"Read ");
  }
  if ((local_260 & 0x100) == 0) {
    strcat(s2 + 0xf8,"Command ");
  }
  else {
    strcat(s2 + 0xf8,"Data ");
  }
  strcat(s2 + 0xf8,local_318);
  HD44780Decode(this,(Frame *)&uStack_258,local_228,display_base);
  __dest = s2 + 0xf8;
  strcat(__dest," (");
  strcat(__dest,local_228);
  strcat(__dest,")");
  AnalyzerResults::AddTabularText
            ((char *)this,__dest,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame((Frame *)&uStack_258);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    char s1[ 256 ], s2[ 256 ];
    Frame frame;

    frame = GetFrame( frame_index );

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    // AddResultString( s1 );

    AddTabularText( s1 );
}